

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPMacAlgorithm.cpp
# Opt level: O3

bool __thiscall OSSLEVPMacAlgorithm::verifyFinal(OSSLEVPMacAlgorithm *this,ByteString *signature)

{
  HMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  uchar *md;
  uint outLen;
  ByteString macResult;
  uint local_44;
  ByteString local_40;
  
  bVar1 = MacAlgorithm::verifyFinal(&this->super_MacAlgorithm,signature);
  if (bVar1) {
    ByteString::ByteString(&local_40);
    iVar2 = (*(this->super_MacAlgorithm)._vptr_MacAlgorithm[0xc])(this);
    local_44 = EVP_MD_get_size(iVar2);
    ByteString::resize(&local_40,(ulong)local_44);
    ctx = (HMAC_CTX *)this->curCTX;
    md = ByteString::operator[](&local_40,0);
    iVar2 = HMAC_Final(ctx,md,&local_44);
    if (iVar2 == 0) {
      softHSMLog(3,"verifyFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
                 ,0xd0,"HMAC_Final failed");
      HMAC_CTX_free(this->curCTX);
      this->curCTX = (HMAC_CTX *)0x0;
      bVar1 = false;
    }
    else {
      HMAC_CTX_free(this->curCTX);
      this->curCTX = (HMAC_CTX *)0x0;
      bVar1 = ByteString::operator==(&local_40,signature);
    }
    local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_40.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OSSLEVPMacAlgorithm::verifyFinal(ByteString& signature)
{
	if (!MacAlgorithm::verifyFinal(signature))
	{
		return false;
	}

	ByteString macResult;
	unsigned int outLen = EVP_MD_size(getEVPHash());
	macResult.resize(outLen);

	if (!HMAC_Final(curCTX, &macResult[0], &outLen))
	{
		ERROR_MSG("HMAC_Final failed");

		HMAC_CTX_free(curCTX);
		curCTX = NULL;

		return false;
	}

	HMAC_CTX_free(curCTX);
	curCTX = NULL;

	return macResult == signature;
}